

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov.cpp
# Opt level: O3

void EBGodunov::ComputeAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,
               int edge_comp,bool known_edgestate,MultiFab *xfluxes,MultiFab *yfluxes,
               MultiFab *zfluxes,int fluxes_comp,MultiFab *fq,int fq_comp,MultiFab *divu,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bc,BCRec *d_bc,Geometry *geom,
               Vector<int,_std::allocator<int>_> *iconserv,Real dt,bool is_velocity,
               string redistribution_type)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  Box *pBVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  pointer piVar7;
  EBCellFlagFab *pEVar8;
  Geometry geom_00;
  string redistribution_type_00;
  Array4<const_double> *pAVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  FabType FVar14;
  FabType FVar15;
  int iVar16;
  long lVar17;
  EBFArrayBoxFactory *this;
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::EBCellFlagFab> *pFVar18;
  Arena *pAVar19;
  long lVar20;
  MultiCutFab *this_01;
  long lVar21;
  long lVar22;
  size_t __n;
  long lVar23;
  FabFactory<amrex::FArrayBox> *pFVar24;
  int i_1;
  size_type a_capacity;
  Geometry *pGVar25;
  Array4<const_double> *pAVar26;
  undefined8 *puVar27;
  long lVar28;
  double **ppdVar29;
  int *piVar30;
  long lVar31;
  long lVar32;
  uint32_t *puVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  uint uVar37;
  bool bVar38;
  byte bVar39;
  undefined8 uVar40;
  int iVar43;
  undefined1 auVar41 [16];
  int iVar44;
  undefined1 auVar42 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar49;
  undefined1 auVar48 [16];
  Periodicity PVar50;
  undefined1 in_stack_fffffffffffff200 [64];
  undefined8 in_stack_fffffffffffff240;
  Array4<const_double> *in_stack_fffffffffffff248;
  Array4<const_double> *in_stack_fffffffffffff250;
  Array4<const_double> *in_stack_fffffffffffff258;
  Array4<const_double> *in_stack_fffffffffffff260;
  Array4<const_double> *in_stack_fffffffffffff268;
  Geometry *in_stack_fffffffffffff270;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffff278;
  BCRec *in_stack_fffffffffffff280;
  int *in_stack_fffffffffffff288;
  undefined8 in_stack_fffffffffffff290;
  Array4<const_double> *in_stack_fffffffffffff298;
  Array4<double> *in_stack_fffffffffffff2a0;
  Array4<const_double> *in_stack_fffffffffffff2a8;
  Array4<const_double> *in_stack_fffffffffffff2b0;
  Array4<const_double> *in_stack_fffffffffffff2b8;
  Array4<const_double> *in_stack_fffffffffffff2c0;
  undefined8 in_stack_fffffffffffff2f8;
  int *in_stack_fffffffffffff300;
  Array4<const_double> *in_stack_fffffffffffff308;
  long local_cf0;
  long local_ce0;
  long local_cd8;
  uint32_t *local_cc8;
  long local_cc0;
  Array4<const_double> *local_ca8;
  Array4<const_double> *local_c98;
  Box local_c84;
  int *local_c68;
  int local_c5c;
  Box result;
  int local_c3c;
  Dim3 local_c38;
  ulong local_c2c;
  int local_c24;
  double *local_b98;
  double *local_b90;
  double *local_b30;
  double *local_b28;
  Array4<const_double> local_b10;
  Array4<const_double> apz;
  Array4<const_double> apy;
  Array4<const_double> apx;
  Array4<double> local_a10;
  Real local_9d0;
  double *local_9c8;
  double *local_9c0;
  long local_9b8;
  long local_9b0;
  double *local_9a8;
  long local_9a0;
  ulong local_998;
  Long local_990;
  long local_988;
  Long local_980;
  double *local_978;
  int local_970;
  int local_96c;
  Array4<const_amrex::EBCellFlag> local_968;
  Array<const_MultiFab_*,_3> u;
  undefined1 local_910 [16];
  int local_900;
  Vector<int,_std::allocator<int>_> *local_8e8;
  undefined1 local_8c8 [32];
  int local_8a8;
  int local_8a4;
  int local_8a0;
  Array4<double> local_888;
  Box result_1;
  int local_828;
  int iStack_824;
  DeviceVector<int> iconserv_d;
  Array4<const_double> local_7d8;
  Array4<double> advc_arr;
  long *local_758 [2];
  long local_748 [2];
  MultiCutFab *local_738;
  FabArray<amrex::EBCellFlagFab> *local_730;
  long local_728;
  long local_720;
  long local_718;
  long local_710;
  long local_708;
  long local_700;
  long local_6f8;
  long local_6f0;
  long local_6e8;
  long local_6e0;
  long local_6d8;
  long local_6d0;
  long local_6c8;
  long local_6c0;
  long local_6b8;
  long local_6b0;
  long local_6a8;
  long local_6a0;
  long local_698;
  long local_690;
  undefined1 local_688 [32];
  Dim3 local_668;
  undefined1 local_65c [16];
  Elixir eli_1;
  int local_628;
  int local_624;
  int local_620;
  Array4<const_double> local_608;
  Array4<const_double> local_5c0;
  Array4<const_double> local_580;
  MultiCutFab *local_540;
  MultiCutFab *local_538;
  MultiCutFab *local_530;
  MultiCutFab *local_528;
  MultiCutFab *local_520;
  MultiCutFab *local_518;
  Array4<const_double> local_510;
  Array4<const_double> local_4d0;
  Elixir eli;
  Array4<const_double> fcz;
  Array4<const_double> fcy;
  Array4<const_double> fcx;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  Dim3 local_398;
  undefined1 local_38c [16];
  Array4<const_amrex::EBCellFlag> local_370;
  MultiFab divu_mac;
  MultiFab advc;
  
  bVar39 = 0;
  uVar34 = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start >> 2;
  iconserv_d.m_data = (pointer)0x0;
  iconserv_d.m_size = 0;
  iconserv_d.m_capacity = 0;
  a_capacity = 0x10;
  if (0x10 < uVar34) {
    do {
      a_capacity = a_capacity * 3 + 1 >> 1;
    } while (a_capacity < uVar34);
  }
  local_c5c = state_comp;
  local_9d0 = dt;
  amrex::PODVector<int,_std::allocator<int>_>::AllocateBuffer(&iconserv_d,a_capacity);
  iconserv_d.m_size = uVar34;
  piVar7 = (iconserv->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish - (long)piVar7;
  if (__n != 0) {
    memcpy(iconserv_d.m_data,piVar7,__n);
  }
  local_c68 = iconserv_d.m_data;
  pFVar24 = (state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  if ((pFVar24 == (FabFactory<amrex::FArrayBox> *)0x0) ||
     (lVar17 = __dynamic_cast(pFVar24,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                              &amrex::EBFArrayBoxFactory::typeinfo), lVar17 == 0)) {
    amrex::Assert_host("state.hasEBFabFactory()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBGodunov/hydro_ebgodunov.cpp"
                       ,0x34,(char *)0x0);
    pFVar24 = (state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
              super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  }
  this = (EBFArrayBoxFactory *)
         __dynamic_cast(pFVar24,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                        &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (this == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  local_730 = amrex::EBDataCollection::getMultiEBCellFlagFab
                        ((this->m_ebdc).
                         super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  amrex::EBDataCollection::getFaceCent
            ((this->m_ebdc).super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  local_738 = amrex::EBDataCollection::getCentroid
                        ((this->m_ebdc).
                         super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  this_00 = &amrex::EBDataCollection::getVolFrac
                       ((this->m_ebdc).
                        super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_FabArray<amrex::FArrayBox>;
  amrex::EBDataCollection::getAreaFrac
            ((this->m_ebdc).super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  bxs = &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x1;
  divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_16_ =
       (undefined1  [16])0x0;
  divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_16_ =
       (undefined1  [16])0x0;
  amrex::MultiFab::MultiFab
            (&advc,bxs,dm,ncomp,3,(MFInfo *)&divu_mac,(FabFactory<amrex::FArrayBox> *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                m_bndryReg.m_typ);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&advc.super_FabArray<amrex::FArrayBox>,0.0,0,
             advc.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
             &advc.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
  u._M_elems[0]._1_7_ = 0;
  u._M_elems[0]._0_1_ = 1;
  u._M_elems[1]._0_4_ = 0;
  u._M_elems[1]._4_4_ = 0;
  u._M_elems[2] = (MultiFab *)0x0;
  local_910 = (undefined1  [16])0x0;
  amrex::MultiFab::MultiFab(&divu_mac,bxs,dm,1,0,(MFInfo *)&u,(FabFactory<amrex::FArrayBox> *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(u._M_elems + 2));
  piVar7 = (iconserv->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  lVar17 = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)piVar7 >> 2;
  u._M_elems[1] = (MultiFab *)CONCAT44(u._M_elems[1]._4_4_,(int)u._M_elems[1]);
  if (0 < lVar17) {
    lVar23 = 0;
    do {
      if (piVar7[lVar23] == 0) {
        u._M_elems[0]._0_1_ = SUB81(umac,0);
        u._M_elems[0]._1_7_ = (undefined7)((ulong)umac >> 8);
        u._M_elems[2] = wmac;
        u._M_elems[1] = vmac;
        bVar38 = amrex::EBFArrayBoxFactory::isAllRegular(this);
        if (bVar38) {
          amrex::computeDivergence(&divu_mac,&u,geom);
        }
        else {
          amrex::EB_computeDivergence(&divu_mac,&u,geom,true);
        }
        break;
      }
      lVar23 = lVar23 + 1;
      u._M_elems[1] = (MultiFab *)CONCAT44(u._M_elems[1]._4_4_,(int)u._M_elems[1]);
    } while (lVar17 != lVar23);
  }
  amrex::MFIter::MFIter((MFIter *)&u,(FabArrayBase *)aofs,true);
  if ((int)local_910._8_4_ < local_900) {
    local_970 = ncomp * 0xe;
    pAVar9 = (Array4<const_double> *)(ulong)(uint)ncomp;
    do {
      amrex::MFIter::tilebox(&local_c84,(MFIter *)&u);
      pFVar18 = amrex::EBDataCollection::getMultiEBCellFlagFab
                          ((this->m_ebdc).
                           super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
      piVar30 = (int *)(local_910 + 8);
      if (local_8e8 != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar30 = (local_8e8->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + (int)local_910._8_4_;
      }
      pEVar8 = (pFVar18->m_fabs_v).
               super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
               _M_impl.super__Vector_impl_data._M_start[*piVar30];
      result.btype.itype = local_c84.btype.itype;
      result.smallend.vect[2] = local_c84.smallend.vect[2] + -3;
      result.bigend.vect[0] = local_c84.bigend.vect[0] + 3;
      result.smallend.vect[1] = local_c84.smallend.vect[1] + -3;
      result.smallend.vect[0] = local_c84.smallend.vect[0] + -3;
      result.bigend.vect[1] = local_c84.bigend.vect[1] + 3;
      result.bigend.vect[2] = local_c84.bigend.vect[2] + 3;
      FVar14 = amrex::EBCellFlagFab::getType(pEVar8,&result);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&local_968,&xfluxes->super_FabArray<amrex::FArrayBox>,
                 (MFIter *)&u,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_a10,&yfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_888,&zfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&apx,&xedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
                 edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&apy,&yedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
                 edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&apz,&zedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
                 edge_comp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&fcx,&umac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&fcy,&vmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&fcz,&wmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&advc_arr,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      FVar15 = amrex::EBCellFlagFab::getType(pEVar8,&local_c84);
      if (FVar15 == covered) {
        amrex::MFIter::nodaltilebox((Box *)&local_7d8,(MFIter *)&u,0);
        amrex::MFIter::nodaltilebox((Box *)&local_b10,(MFIter *)&u,1);
        amrex::MFIter::nodaltilebox((Box *)&local_4d0,(MFIter *)&u,2);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&result,&aofs->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
                   aofs_comp);
        auVar12 = _DAT_0065b9b0;
        auVar11 = _DAT_0065b9a0;
        if (0 < ncomp) {
          lVar17 = CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8;
          local_cf0 = result.smallend.vect._0_8_ +
                      ((long)local_c84.smallend.vect[1] - (long)local_c38.y) * lVar17 +
                      (long)local_c84.smallend.vect[0] * 8 + (long)local_c38.x * -8 + 8;
          uVar37 = local_c84.bigend.vect[0] - local_c84.smallend.vect[0];
          auVar46._4_4_ = 0;
          auVar46._0_4_ = uVar37;
          auVar46._8_4_ = uVar37;
          auVar46._12_4_ = 0;
          auVar46 = auVar46 ^ _DAT_0065b9b0;
          pAVar26 = (Array4<const_double> *)0x0;
          do {
            iVar16 = local_c84.smallend.vect[2];
            if (local_c84.smallend.vect[2] <= local_c84.bigend.vect[2]) {
              do {
                if (local_c84.smallend.vect[1] <= local_c84.bigend.vect[1]) {
                  lVar35 = ((long)iVar16 - (long)local_c38.z) *
                           CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 + local_cf0;
                  lVar23 = (long)local_c84.smallend.vect[1];
                  do {
                    if (local_c84.smallend.vect[0] <= local_c84.bigend.vect[0]) {
                      uVar34 = 0;
                      do {
                        auVar48._8_4_ = (int)uVar34;
                        auVar48._0_8_ = uVar34;
                        auVar48._12_4_ = (int)(uVar34 >> 0x20);
                        auVar48 = (auVar48 | auVar11) ^ auVar12;
                        bVar38 = auVar46._0_4_ < auVar48._0_4_;
                        iVar43 = auVar46._4_4_;
                        iVar44 = auVar48._4_4_;
                        if ((bool)(~(iVar43 < iVar44 || iVar44 == iVar43 && bVar38) & 1)) {
                          *(undefined8 *)(lVar35 + -8 + uVar34 * 8) = 0x483d6329f1c35ca5;
                        }
                        if (iVar43 >= iVar44 && (iVar44 != iVar43 || !bVar38)) {
                          *(undefined8 *)(lVar35 + uVar34 * 8) = 0x483d6329f1c35ca5;
                        }
                        uVar34 = uVar34 + 2;
                      } while (((ulong)uVar37 + 2 & 0x1fffffffe) != uVar34);
                    }
                    lVar23 = lVar23 + 1;
                    lVar35 = lVar35 + lVar17;
                  } while (local_c84.bigend.vect[1] + 1U != (int)lVar23);
                }
                bVar38 = iVar16 != local_c84.bigend.vect[2];
                iVar16 = iVar16 + 1;
              } while (bVar38);
            }
            pAVar26 = (Array4<const_double> *)((long)&pAVar26->p + 1);
            local_cf0 = local_cf0 + CONCAT44(local_c3c,result.btype.itype) * 8;
          } while (pAVar26 != pAVar9);
          lVar17 = (long)local_7d8.p._4_4_;
          local_cd8 = (long)apx.p +
                      (lVar17 - apx.begin.y) * apx.jstride * 8 + (long)(int)local_7d8.p * 8 +
                      (long)apx.begin.x * -8;
          local_cc8 = (uint32_t *)
                      ((long)&local_968.p[(long)local_968.begin.x * -2 + (long)(int)local_7d8.p * 2]
                              .flag + (lVar17 - local_968.begin.y) * local_968.jstride * 8);
          pAVar26 = (Array4<const_double> *)0x0;
          do {
            iVar16 = (int)local_7d8.jstride;
            if ((int)local_7d8.jstride <= local_7d8.kstride._4_4_) {
              do {
                if (local_7d8.p._4_4_ <= (int)local_7d8.kstride) {
                  lVar35 = ((long)iVar16 - (long)apx.begin.z) * apx.kstride * 8 + local_cd8;
                  puVar33 = (uint32_t *)
                            (((long)iVar16 - (long)local_968.begin.z) * local_968.kstride * 8 +
                            (long)local_cc8);
                  lVar23 = lVar17;
                  do {
                    if ((int)local_7d8.p <= local_7d8.jstride._4_4_) {
                      lVar28 = 0;
                      do {
                        *(undefined8 *)(puVar33 + lVar28 * 2) = 0;
                        *(undefined8 *)(lVar35 + lVar28 * 8) = 0x483d6329f1c35ca5;
                        lVar28 = lVar28 + 1;
                      } while ((local_7d8.jstride._4_4_ - (int)local_7d8.p) + 1 != (int)lVar28);
                    }
                    lVar23 = lVar23 + 1;
                    lVar35 = lVar35 + apx.jstride * 8;
                    puVar33 = puVar33 + local_968.jstride * 2;
                  } while ((int)local_7d8.kstride + 1 != (int)lVar23);
                }
                bVar38 = iVar16 != local_7d8.kstride._4_4_;
                iVar16 = iVar16 + 1;
              } while (bVar38);
            }
            pAVar26 = (Array4<const_double> *)((long)&pAVar26->p + 1);
            local_cd8 = local_cd8 + apx.nstride * 8;
            local_cc8 = local_cc8 + local_968.nstride * 2;
          } while (pAVar26 != pAVar9);
          in_stack_fffffffffffff300 = (int *)(local_b10.jstride & 0xffffffff);
          lVar17 = (long)local_b10.p._4_4_;
          local_cc0 = (long)apy.p +
                      (lVar17 - apy.begin.y) * apy.jstride * 8 + (long)(int)local_b10.p * 8 +
                      (long)apy.begin.x * -8;
          local_ce0 = (long)local_a10.p +
                      (lVar17 - local_a10.begin.y) * local_a10.jstride * 8 +
                      (long)(int)local_b10.p * 8 + (long)local_a10.begin.x * -8;
          pAVar26 = (Array4<const_double> *)0x0;
          do {
            in_stack_fffffffffffff308 = pAVar26;
            iVar16 = (int)local_b10.jstride;
            if ((int)local_b10.jstride <= local_b10.kstride._4_4_) {
              do {
                if (local_b10.p._4_4_ <= (int)local_b10.kstride) {
                  lVar28 = ((long)iVar16 - (long)apy.begin.z) * apy.kstride * 8 + local_cc0;
                  lVar35 = ((long)iVar16 - (long)local_a10.begin.z) * local_a10.kstride * 8 +
                           local_ce0;
                  lVar23 = lVar17;
                  do {
                    if ((int)local_b10.p <= local_b10.jstride._4_4_) {
                      lVar31 = 0;
                      do {
                        *(undefined8 *)(lVar35 + lVar31 * 8) = 0;
                        *(undefined8 *)(lVar28 + lVar31 * 8) = 0x483d6329f1c35ca5;
                        lVar31 = lVar31 + 1;
                      } while ((local_b10.jstride._4_4_ - (int)local_b10.p) + 1 != (int)lVar31);
                    }
                    lVar23 = lVar23 + 1;
                    lVar28 = lVar28 + apy.jstride * 8;
                    lVar35 = lVar35 + local_a10.jstride * 8;
                  } while ((int)local_b10.kstride + 1 != (int)lVar23);
                }
                bVar38 = iVar16 != local_b10.kstride._4_4_;
                iVar16 = iVar16 + 1;
              } while (bVar38);
            }
            pAVar26 = (Array4<const_double> *)((long)&in_stack_fffffffffffff308->p + 1);
            local_cc0 = local_cc0 + apy.nstride * 8;
            local_ce0 = local_ce0 + local_a10.nstride * 8;
          } while (pAVar26 != pAVar9);
        }
        if (0 < ncomp) {
          lVar17 = (long)local_4d0.p._4_4_;
          in_stack_fffffffffffff308 =
               (Array4<const_double> *)
               ((lVar17 - apz.begin.y) * apz.jstride * 8 + (long)(int)local_4d0.p * 8 +
                (long)apz.begin.x * -8 + (long)apz.p);
          in_stack_fffffffffffff300 =
               (int *)((lVar17 - local_888.begin.y) * local_888.jstride * 8 +
                       (long)(int)local_4d0.p * 8 + (long)local_888.begin.x * -8 + (long)local_888.p
                      );
          pAVar26 = (Array4<const_double> *)0x0;
          do {
            iVar16 = (int)local_4d0.jstride;
            if ((int)local_4d0.jstride <= local_4d0.kstride._4_4_) {
              do {
                if (local_4d0.p._4_4_ <= (int)local_4d0.kstride) {
                  ppdVar29 = (double **)
                             ((long)&in_stack_fffffffffffff308->p +
                             ((long)iVar16 - (long)apz.begin.z) * apz.kstride * 8);
                  piVar30 = (int *)(((long)iVar16 - (long)local_888.begin.z) * local_888.kstride * 8
                                   + (long)in_stack_fffffffffffff300);
                  lVar23 = lVar17;
                  do {
                    if ((int)local_4d0.p <= local_4d0.jstride._4_4_) {
                      lVar35 = 0;
                      do {
                        (piVar30 + lVar35 * 2)[0] = 0;
                        (piVar30 + lVar35 * 2)[1] = 0;
                        ppdVar29[lVar35] = (double *)0x483d6329f1c35ca5;
                        lVar35 = lVar35 + 1;
                      } while ((local_4d0.jstride._4_4_ - (int)local_4d0.p) + 1 != (int)lVar35);
                    }
                    lVar23 = lVar23 + 1;
                    ppdVar29 = ppdVar29 + apz.jstride;
                    piVar30 = piVar30 + local_888.jstride * 2;
                  } while ((int)local_4d0.kstride + 1 != (int)lVar23);
                }
                bVar38 = iVar16 != local_4d0.kstride._4_4_;
                iVar16 = iVar16 + 1;
              } while (bVar38);
            }
            pAVar26 = (Array4<const_double> *)((long)&pAVar26->p + 1);
            in_stack_fffffffffffff308 =
                 (Array4<const_double> *)(&in_stack_fffffffffffff308->p + apz.nstride);
            in_stack_fffffffffffff300 = in_stack_fffffffffffff300 + local_888.nstride * 2;
          } while (pAVar26 != pAVar9);
        }
      }
      else if (FVar14 == regular) {
        if (!known_edgestate) {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&result,&state->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&u,local_c5c);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_7d8,&divu->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_b10,&fq->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fq_comp);
          pGVar25 = geom;
          puVar27 = (undefined8 *)&stack0xfffffffffffff200;
          for (lVar17 = 0x19; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar27 = *(undefined8 *)&pGVar25->super_CoordSys;
            pGVar25 = (Geometry *)((long)pGVar25 + (ulong)bVar39 * -0x10 + 8);
            puVar27 = puVar27 + (ulong)bVar39 * -2 + 1;
          }
          geom_00.super_CoordSys.inv_dx[1] = (Real)in_stack_fffffffffffff240;
          geom_00.super_CoordSys.c_sys = in_stack_fffffffffffff200._0_4_;
          geom_00.super_CoordSys._4_4_ = in_stack_fffffffffffff200._4_4_;
          geom_00.super_CoordSys.offset[0] = (Real)in_stack_fffffffffffff200._8_8_;
          geom_00.super_CoordSys.offset[1] = (Real)in_stack_fffffffffffff200._16_8_;
          geom_00.super_CoordSys.offset[2] = (Real)in_stack_fffffffffffff200._24_8_;
          geom_00.super_CoordSys.dx[0] = (Real)in_stack_fffffffffffff200._32_8_;
          geom_00.super_CoordSys.dx[1] = (Real)in_stack_fffffffffffff200._40_8_;
          geom_00.super_CoordSys.dx[2] = (Real)in_stack_fffffffffffff200._48_8_;
          geom_00.super_CoordSys.inv_dx[0] = (Real)in_stack_fffffffffffff200._56_8_;
          geom_00.super_CoordSys.inv_dx[2] = (Real)in_stack_fffffffffffff248;
          geom_00.super_CoordSys._80_8_ = in_stack_fffffffffffff250;
          geom_00.prob_domain.xlo[0] = (Real)in_stack_fffffffffffff258;
          geom_00.prob_domain.xlo[1] = (Real)in_stack_fffffffffffff260;
          geom_00.prob_domain.xlo[2] = (Real)in_stack_fffffffffffff268;
          geom_00.prob_domain.xhi[0] = (Real)in_stack_fffffffffffff270;
          geom_00.prob_domain.xhi[1] = (Real)in_stack_fffffffffffff278;
          geom_00.prob_domain.xhi[2] = (Real)in_stack_fffffffffffff280;
          geom_00.roundoff_hi_d.arr[0] = (double)in_stack_fffffffffffff288;
          geom_00.roundoff_hi_d.arr[1] = (double)in_stack_fffffffffffff290;
          geom_00.roundoff_hi_d.arr[2] = (double)in_stack_fffffffffffff298;
          geom_00.roundoff_hi_f.arr._0_8_ = in_stack_fffffffffffff2a0;
          geom_00._168_8_ = in_stack_fffffffffffff2a8;
          geom_00.domain.smallend.vect._4_8_ = in_stack_fffffffffffff2b0;
          geom_00.domain.bigend.vect._0_8_ = in_stack_fffffffffffff2b8;
          geom_00.domain._20_8_ = in_stack_fffffffffffff2c0;
          Godunov::ComputeEdgeState
                    (&local_c84,ncomp,(Array4<const_double> *)&result,(Array4<double> *)&apx,
                     (Array4<double> *)&apy,(Array4<double> *)&apz,&fcx,&fcy,&fcz,&local_7d8,
                     &local_b10,geom_00,local_9d0,d_bc,local_c68,false,false,is_velocity);
        }
        result.smallend.vect._0_8_ = apx.p;
        result.smallend.vect[2] = (int)apx.jstride;
        result.bigend.vect[0] = (int)((ulong)apx.jstride >> 0x20);
        result.bigend.vect[1] = (int)apx.kstride;
        result.bigend.vect[2] = (int)((ulong)apx.kstride >> 0x20);
        result.btype.itype = (uint)apx.nstride;
        local_7d8.p = apy.p;
        local_7d8.jstride = apy.jstride;
        local_7d8.kstride = apy.kstride;
        local_7d8.nstride = apy.nstride;
        local_7d8.begin.z = apy.begin.z;
        local_7d8.end.z = apy.end.z;
        local_7d8.end.x = apy.end.x;
        local_7d8.end.y = apy.end.y;
        local_7d8.ncomp = apy.ncomp;
        local_b10.p = apz.p;
        local_b10.jstride = apz.jstride;
        local_b10.kstride = apz.kstride;
        local_b10.nstride = apz.nstride;
        local_b10.begin.z = apz.begin.z;
        local_b10.end.z = apz.end.z;
        local_b10.end.x = apz.end.x;
        local_b10.end.y = apz.end.y;
        local_b10.ncomp = apz.ncomp;
        in_stack_fffffffffffff2c0 = (Array4<const_double> *)&result;
        in_stack_fffffffffffff2b8 = &fcz;
        in_stack_fffffffffffff2b0 = (Array4<const_double> *)0x2efa0b;
        HydroUtils::ComputeFluxes
                  (&local_c84,(Array4<double> *)&local_968,&local_a10,&local_888,&fcx,&fcy,
                   in_stack_fffffffffffff2b8,in_stack_fffffffffffff2c0,&local_7d8,&local_b10,geom,
                   ncomp,true);
        iVar16 = local_968.begin.z;
        uVar13 = local_968.begin._0_8_;
        result.smallend.vect._0_8_ = local_968.p;
        result.smallend.vect[2] = (int)local_968.jstride;
        result.bigend.vect[0] = (int)((ulong)local_968.jstride >> 0x20);
        result.bigend.vect[1] = (int)local_968.kstride;
        result.bigend.vect[2] = (int)((ulong)local_968.kstride >> 0x20);
        result.btype.itype = (uint)local_968.nstride;
        local_c3c = (int)((ulong)local_968.nstride >> 0x20);
        local_c38.z = local_968.begin.z;
        local_c38.x = local_968.begin.x;
        local_c38.y = local_968.begin.y;
        uVar40 = local_c38._0_8_;
        local_c24 = local_968.end.z;
        local_c2c._0_4_ = local_968.end.x;
        local_c2c._4_4_ = local_968.end.y;
        local_7d8.p = local_a10.p;
        local_7d8.jstride = local_a10.jstride;
        local_7d8.kstride = local_a10.kstride;
        local_7d8.nstride = local_a10.nstride;
        local_7d8.begin.z = local_a10.begin.z;
        local_7d8.end.z = local_a10.end.z;
        local_7d8.end.x = local_a10.end.x;
        local_7d8.end.y = local_a10.end.y;
        local_7d8.ncomp = local_a10.ncomp;
        local_b10.p = local_888.p;
        local_b10.jstride = local_888.jstride;
        local_b10.kstride = local_888.kstride;
        local_b10.nstride = local_888.nstride;
        local_b10.begin.z = local_888.begin.z;
        local_b10.begin.y = local_888.begin.y;
        local_b10.begin.x = local_888.begin.x;
        local_b10.end.z = local_888.end.z;
        local_b10.end.x = local_888.end.x;
        local_b10.end.y = local_888.end.y;
        local_b10.ncomp = local_888.ncomp;
        HydroUtils::ComputeDivergence
                  (&local_c84,&advc_arr,(Array4<const_double> *)&result,&local_7d8,&local_b10,ncomp,
                   geom,-1.0,true);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&result,&divu_mac.super_FabArray<amrex::FArrayBox>,(MFIter *)&u
                  );
        local_c38._0_8_ = uVar40;
        if (0 < ncomp) {
          local_980 = apx.kstride;
          local_9a0 = apx.nstride;
          local_988 = (long)apx.begin.z;
          local_9a8 = apy.p;
          local_990 = apy.kstride;
          local_9b0 = apy.nstride;
          local_9b8 = apz.nstride;
          local_9c0 = advc_arr.p;
          local_9c8 = (double *)advc_arr.nstride;
          local_998 = (ulong)advc_arr.begin.z;
          local_c38.y = SUB84(uVar13,4);
          lVar17 = (long)local_c38.y;
          local_c38.x = (int)uVar13;
          in_stack_fffffffffffff300 = (int *)(long)local_c38.x;
          local_ca8 = (Array4<const_double> *)0x0;
          do {
            if (local_c84.smallend.vect[2] <= local_c84.bigend.vect[2]) {
              local_978 = advc_arr.p + (long)local_ca8 * advc_arr.nstride;
              iVar43 = local_c84.smallend.vect[2];
              do {
                if (local_c84.smallend.vect[1] <= local_c84.bigend.vect[1]) {
                  lVar23 = (long)iVar43;
                  lVar28 = (lVar23 - local_988) * apx.kstride;
                  lVar31 = (lVar23 - apy.begin.z) * apy.kstride;
                  in_stack_fffffffffffff308 =
                       (Array4<const_double> *)((iVar43 - apz.begin.z) * apz.kstride);
                  lVar35 = (lVar23 - local_998) * advc_arr.kstride;
                  iVar44 = local_c84.smallend.vect[1];
                  do {
                    if (local_c84.smallend.vect[0] <= local_c84.bigend.vect[0]) {
                      iVar49 = local_c68[(long)local_ca8];
                      lVar36 = (long)iVar44;
                      lVar20 = (lVar36 - apx.begin.y) * apx.jstride;
                      lVar32 = (lVar36 - apz.begin.y) * apz.jstride;
                      lVar21 = (lVar36 - advc_arr.begin.y) * advc_arr.jstride;
                      lVar22 = (long)local_c84.smallend.vect[0];
                      do {
                        iVar10 = (int)lVar22;
                        if (iVar49 == 0) {
                          local_978[lVar35 + lVar21 + (lVar22 - advc_arr.begin.x)] =
                               ((apz.p[(long)in_stack_fffffffffffff308 +
                                       lVar32 + (lVar22 - apz.begin.x) +
                                                (long)local_ca8 * apz.nstride] +
                                 apz.p[lVar32 + (lVar22 - apz.begin.x) +
                                                ((iVar43 + 1) - apz.begin.z) * apz.kstride +
                                                (long)local_ca8 * apz.nstride] +
                                apx.p[(long)local_ca8 * apx.nstride +
                                      lVar28 + lVar20 + (lVar22 - apx.begin.x)] +
                                apx.p[(long)local_ca8 * apx.nstride +
                                      lVar28 + lVar20 + ((iVar10 + 1) - apx.begin.x)] +
                                apy.p[(long)local_ca8 * apy.nstride +
                                      lVar31 + (iVar44 - apy.begin.y) * apy.jstride +
                                               (lVar22 - apy.begin.x)] +
                                apy.p[(long)local_ca8 * apy.nstride +
                                      lVar31 + ((iVar44 + 1) - apy.begin.y) * apy.jstride +
                                               (lVar22 - apy.begin.x)]) / 6.0) *
                               *(double *)
                                (result.smallend.vect._0_8_ +
                                 (lVar23 - iVar16) *
                                 CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                                 (lVar36 - lVar17) *
                                 CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                                (lVar22 - (long)in_stack_fffffffffffff300) * 8) +
                               local_978[lVar35 + lVar21 + (lVar22 - advc_arr.begin.x)];
                        }
                        lVar22 = lVar22 + 1;
                      } while (iVar10 + 1 != local_c84.bigend.vect[0] + 1);
                    }
                    iVar44 = iVar44 + 1;
                  } while (iVar44 != local_c84.bigend.vect[1] + 1U);
                }
                bVar38 = iVar43 != local_c84.bigend.vect[2];
                iVar43 = iVar43 + 1;
              } while (bVar38);
            }
            local_ca8 = (Array4<const_double> *)((long)&local_ca8->p + 1);
          } while (local_ca8 != pAVar9);
        }
      }
      else {
        amrex::MultiCutFab::const_array(&local_7d8,local_528,(MFIter *)&u);
        amrex::MultiCutFab::const_array(&local_b10,local_520,(MFIter *)&u);
        amrex::MultiCutFab::const_array(&local_4d0,local_518,(MFIter *)&u);
        amrex::MultiCutFab::const_array(&local_510,local_540,(MFIter *)&u);
        amrex::MultiCutFab::const_array((Array4<const_double> *)local_688,local_538,(MFIter *)&u);
        amrex::MultiCutFab::const_array((Array4<const_double> *)local_8c8,local_530,(MFIter *)&u);
        amrex::MultiCutFab::const_array(&local_608,local_738,(MFIter *)&u);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&eli_1,this_00,(MFIter *)&u);
        amrex::FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_370,local_730,(MFIter *)&u);
        iVar16 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
        iVar16 = (iVar16 == 0) + 4;
        result_1.smallend.vect[0] = local_c84.smallend.vect[0] - iVar16;
        result_1.smallend.vect[1] = local_c84.smallend.vect[1] - iVar16;
        result_1.smallend.vect[2] = local_c84.smallend.vect[2] - iVar16;
        result_1.bigend.vect[0] = local_c84.bigend.vect[0] + iVar16;
        result_1.bigend.vect[1] = iVar16 + local_c84.bigend.vect[1];
        result_1.bigend.vect[2] = iVar16 + local_c84.bigend.vect[2];
        amrex::FArrayBox::FArrayBox
                  ((FArrayBox *)&result,&result_1,local_970,true,false,(Arena *)0x0);
        pAVar19 = (Arena *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
        if (pAVar19 == (Arena *)0x0) {
          pAVar19 = amrex::The_Arena();
        }
        amrex::Gpu::Elixir::Elixir(&eli,(void *)0x0,pAVar19);
        if (!known_edgestate) {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&result_1,&state->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&u,local_c5c);
          in_stack_fffffffffffff260 = &local_580;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_fffffffffffff260,&divu->super_FabArray<amrex::FArrayBox>,(MFIter *)&u)
          ;
          in_stack_fffffffffffff268 = &local_5c0;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_fffffffffffff268,&fq->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
                     fq_comp);
          local_3a8 = (undefined1  [16])0x0;
          local_3b8 = (undefined1  [16])0x0;
          local_398.x = 1;
          local_398.y = 1;
          local_398.z = 1;
          local_38c = (undefined1  [16])0x0;
          in_stack_fffffffffffff258 = &fcz;
          in_stack_fffffffffffff250 = &fcy;
          in_stack_fffffffffffff248 = &fcx;
          in_stack_fffffffffffff240 = 0x2ee178;
          in_stack_fffffffffffff270 = geom;
          in_stack_fffffffffffff278 = h_bc;
          in_stack_fffffffffffff280 = d_bc;
          in_stack_fffffffffffff288 = local_c68;
          ComputeEdgeState(&local_c84,ncomp,(Array4<const_double> *)&result_1,(Array4<double> *)&apx
                           ,(Array4<double> *)&apy,(Array4<double> *)&apz,in_stack_fffffffffffff248,
                           in_stack_fffffffffffff250,in_stack_fffffffffffff258,
                           in_stack_fffffffffffff260,in_stack_fffffffffffff268,geom,local_9d0,h_bc,
                           d_bc,local_c68,
                           (Real *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]),&local_370,
                           &local_510,(Array4<const_double> *)local_688,
                           (Array4<const_double> *)local_8c8,(Array4<const_double> *)&eli_1,
                           &local_7d8,&local_b10,&local_4d0,&local_608,is_velocity,
                           (Array4<const_double> *)local_3b8);
        }
        result_1.smallend.vect[0] = (int)apx.p;
        result_1.smallend.vect[1] = (int)((ulong)apx.p >> 0x20);
        result_1.smallend.vect[2] = (int)apx.jstride;
        result_1.bigend.vect[0] = (int)((ulong)apx.jstride >> 0x20);
        result_1.bigend.vect[1] = (int)apx.kstride;
        result_1.bigend.vect[2] = (int)((ulong)apx.kstride >> 0x20);
        result_1.btype.itype = (uint)apx.nstride;
        local_580.p = apy.p;
        local_580.jstride = apy.jstride;
        local_580.kstride = apy.kstride;
        local_580.nstride = apy.nstride;
        local_580.begin.z = apy.begin.z;
        local_580.end.z = apy.end.z;
        local_580.end.x = apy.end.x;
        local_580.end.y = apy.end.y;
        local_580.ncomp = apy.ncomp;
        local_5c0.p = apz.p;
        local_5c0.jstride = apz.jstride;
        local_5c0.kstride = apz.kstride;
        local_5c0.nstride = apz.nstride;
        local_5c0.begin.z = apz.begin.z;
        local_5c0.end.z = apz.end.z;
        local_5c0.end.x = apz.end.x;
        local_5c0.end.y = apz.end.y;
        local_5c0.ncomp = apz.ncomp;
        in_stack_fffffffffffff2c0 = (Array4<const_double> *)local_688;
        in_stack_fffffffffffff2b8 = &local_510;
        in_stack_fffffffffffff298 = &fcz;
        in_stack_fffffffffffff290 = 0x2ee349;
        in_stack_fffffffffffff2a0 = (Array4<double> *)&result_1;
        in_stack_fffffffffffff2a8 = &local_580;
        in_stack_fffffffffffff2b0 = &local_5c0;
        HydroUtils::EB_ComputeFluxes
                  (&local_c84,(Array4<double> *)&local_968,&local_a10,&local_888,&fcx,&fcy,
                   in_stack_fffffffffffff298,(Array4<const_double> *)&result_1,&local_580,&local_5c0
                   ,in_stack_fffffffffffff2b8,in_stack_fffffffffffff2c0,
                   (Array4<const_double> *)local_8c8,geom,ncomp,&local_370,true);
        iVar16 = local_968.begin.z;
        uVar40 = local_968.begin._0_8_;
        result_1.smallend.vect[0] = (int)local_968.p;
        result_1.smallend.vect[1] = (int)((ulong)local_968.p >> 0x20);
        result_1.smallend.vect[2] = (int)local_968.jstride;
        result_1.bigend.vect[0] = (int)((ulong)local_968.jstride >> 0x20);
        result_1.bigend.vect[1] = (int)local_968.kstride;
        result_1.bigend.vect[2] = (int)((ulong)local_968.kstride >> 0x20);
        result_1.btype.itype = (uint)local_968.nstride;
        local_580.p = local_a10.p;
        local_580.jstride = local_a10.jstride;
        local_580.kstride = local_a10.kstride;
        local_580.nstride = local_a10.nstride;
        local_580.begin.z = local_a10.begin.z;
        local_580.end.z = local_a10.end.z;
        local_580.end.x = local_a10.end.x;
        local_580.end.y = local_a10.end.y;
        local_580.ncomp = local_a10.ncomp;
        local_5c0.p = local_888.p;
        local_5c0.jstride = local_888.jstride;
        local_5c0.kstride = local_888.kstride;
        local_5c0.nstride = local_888.nstride;
        local_5c0.begin.z = local_888.begin.z;
        local_5c0.end.z = local_888.end.z;
        local_5c0.end.x = local_888.end.x;
        local_5c0.end.y = local_888.end.y;
        local_5c0.ncomp = local_888.ncomp;
        HydroUtils::EB_ComputeDivergence
                  (&local_c84,&advc_arr,(Array4<const_double> *)&result_1,&local_580,&local_5c0,
                   (Array4<const_double> *)&eli_1,ncomp,geom,-1.0,true);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&result_1,&divu_mac.super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&u);
        if (0 < ncomp) {
          local_828 = (int)uVar40;
          lVar23 = (long)local_c84.smallend.vect[0];
          lVar17 = lVar23 * 8;
          local_b90 = advc_arr.p + (lVar23 - advc_arr.begin.x);
          local_710 = advc_arr.nstride * 8;
          local_9a0 = -(long)advc_arr.begin.z;
          local_9b0 = lVar17 + (long)local_828 * -8 +
                      CONCAT44(result_1.smallend.vect[1],result_1.smallend.vect[0]);
          local_690 = CONCAT44(result_1.bigend.vect[2],result_1.bigend.vect[1]) * 8;
          local_698 = -(long)iVar16;
          local_9b8 = lVar17 + (long)local_8a8 * -8 + CONCAT44(local_8c8._4_4_,local_8c8._0_4_);
          local_6a0 = CONCAT44(local_8c8._20_4_,local_8c8._16_4_) * 8;
          local_6a8 = -(long)local_8a0;
          local_b28 = apz.p + (lVar23 - apz.begin.x);
          local_718 = apz.nstride * 8;
          local_6b0 = apz.kstride * 8;
          local_6b8 = -(long)apz.begin.z;
          local_9c0 = (double *)(local_688._0_8_ + (lVar23 - local_668.x) * 8);
          local_6c0 = local_688._16_8_ * 8;
          local_6c8 = -(long)local_668.z;
          local_b30 = apy.p + (lVar23 - apy.begin.x);
          local_720 = apy.nstride * 8;
          local_6d0 = apy.kstride * 8;
          local_6d8 = -(long)apy.begin.z;
          local_9c8 = local_510.p + (lVar23 - local_510.begin.x);
          local_6e0 = local_510.kstride * 8;
          local_6e8 = -(long)local_510.begin.z;
          local_b98 = apx.p + (lVar23 - apx.begin.x);
          local_728 = apx.nstride * 8;
          local_6f0 = apx.kstride * 8;
          local_6f8 = -(long)apx.begin.z;
          local_9a8 = (double *)
                      (lVar17 + (long)local_628 * -8 +
                      (long)eli_1.m_pa.
                            super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                            .
                            super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          local_700 = (long)eli_1.m_pa.
                            super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                            .
                            super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage * 8;
          local_708 = -(long)local_620;
          local_978 = (double *)CONCAT44(local_978._4_4_,local_8a4);
          local_980 = CONCAT44(local_980._4_4_,advc_arr.begin.y);
          iStack_824 = SUB84(uVar40,4);
          local_988 = CONCAT44(local_988._4_4_,iStack_824);
          local_998 = (ulong)(uint)local_c84.bigend.vect[1];
          local_96c = local_c84.smallend.vect[2] + 1;
          local_c98 = (Array4<const_double> *)0x0;
          local_990 = CONCAT44(local_990._4_4_,local_c84.bigend.vect[1] + 1U);
          do {
            iVar16 = local_c84.smallend.vect[2];
            iVar43 = local_96c;
            if (local_c84.smallend.vect[2] <= local_c84.bigend.vect[2]) {
              do {
                if (local_c84.smallend.vect[1] <= local_c84.bigend.vect[1]) {
                  lVar23 = (long)iVar16;
                  lVar17 = (local_6c8 + lVar23) * local_6c0;
                  lVar35 = (local_6d8 + lVar23) * local_6d0;
                  iVar44 = local_c84.smallend.vect[1];
                  do {
                    if (local_c84.smallend.vect[0] <= local_c84.bigend.vect[0]) {
                      iVar49 = local_c68[(long)local_c98];
                      lVar22 = (long)(iVar44 - apx.begin.y) * apx.jstride * 8 +
                               (local_6f8 + lVar23) * local_6f0;
                      lVar28 = (long)(iVar44 - local_510.begin.y) * local_510.jstride * 8 +
                               (local_6e8 + lVar23) * local_6e0;
                      lVar36 = (long)(iVar44 - apz.begin.y) * apz.jstride * 8;
                      lVar20 = (long)(iVar44 - local_8a4) *
                               CONCAT44(local_8c8._12_4_,local_8c8._8_4_) * 8;
                      lVar31 = (long)(iVar44 - advc_arr.begin.y) * advc_arr.jstride * 8 +
                               (local_9a0 + lVar23) * advc_arr.kstride * 8;
                      in_stack_fffffffffffff308 =
                           (Array4<const_double> *)
                           ((local_6a8 + iVar43) * local_6a0 + local_9b8 + lVar20);
                      in_stack_fffffffffffff300 =
                           (int *)((long)local_b28 + lVar36 + (iVar43 + local_6b8) * local_6b0);
                      lVar32 = 0;
                      do {
                        if ((iVar49 == 0) &&
                           ((dVar2 = *(double *)
                                      ((long)local_9a8 +
                                      lVar32 * 8 +
                                      (long)(iVar44 - local_624) *
                                      (long)eli_1.m_pa.
                                            super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                                            .
                                            super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish * 8 +
                                      (lVar23 + local_708) * local_700), dVar2 != 0.0 ||
                            (NAN(dVar2))))) {
                          dVar2 = *(double *)((long)local_9c8 + lVar32 * 8 + lVar28);
                          dVar3 = *(double *)((long)local_9c8 + lVar32 * 8 + lVar28 + 8);
                          dVar4 = *(double *)
                                   ((long)local_9c0 +
                                   lVar32 * 8 +
                                   (long)(iVar44 - local_668.y) * local_688._8_8_ * 8 + lVar17);
                          dVar5 = *(double *)
                                   ((long)local_9c0 +
                                   lVar32 * 8 +
                                   (long)((iVar44 + 1) - local_668.y) * local_688._8_8_ * 8 + lVar17
                                   );
                          dVar6 = *(double *)
                                   (lVar20 + (local_6a8 + lVar23) * local_6a0 + local_9b8 +
                                   lVar32 * 8);
                          *(double *)((long)local_b90 + lVar32 * 8 + lVar31) =
                               ((*(double *)
                                  ((long)local_b28 +
                                  lVar32 * 8 + lVar36 + (local_6b8 + lVar23) * local_6b0) * dVar6 +
                                 *(double *)(in_stack_fffffffffffff300 + lVar32 * 2) *
                                 (double)(&in_stack_fffffffffffff308->p)[lVar32] +
                                *(double *)
                                 ((long)local_b30 +
                                 lVar32 * 8 +
                                 (long)((iVar44 + 1) - apy.begin.y) * apy.jstride * 8 + lVar35) *
                                dVar5 + *(double *)
                                         ((long)local_b30 +
                                         lVar32 * 8 +
                                         (long)(iVar44 - apy.begin.y) * apy.jstride * 8 + lVar35) *
                                        dVar4 + *(double *)((long)local_b98 + lVar32 * 8 + lVar22) *
                                                dVar2 + *(double *)
                                                         ((long)local_b98 + lVar32 * 8 + lVar22 + 8)
                                                        * dVar3) /
                               (dVar2 + dVar3 + dVar4 + dVar5 + dVar6 +
                               (double)(&in_stack_fffffffffffff308->p)[lVar32])) *
                               *(double *)
                                ((long)(iVar44 - iStack_824) *
                                 CONCAT44(result_1.bigend.vect[0],result_1.smallend.vect[2]) * 8 +
                                 (local_698 + lVar23) * local_690 + local_9b0 + lVar32 * 8) +
                               *(double *)((long)local_b90 + lVar32 * 8 + lVar31);
                        }
                        lVar32 = lVar32 + 1;
                      } while ((local_c84.bigend.vect[0] - local_c84.smallend.vect[0]) + 1 !=
                               (int)lVar32);
                    }
                    iVar44 = iVar44 + 1;
                  } while (iVar44 != local_c84.bigend.vect[1] + 1U);
                }
                bVar38 = iVar16 != local_c84.bigend.vect[2];
                iVar16 = iVar16 + 1;
                iVar43 = iVar43 + 1;
              } while (bVar38);
            }
            local_c98 = (Array4<const_double> *)((long)&local_c98->p + 1);
            local_b90 = local_b90 + advc_arr.nstride;
            local_b28 = local_b28 + apz.nstride;
            local_b30 = local_b30 + apy.nstride;
            local_b98 = local_b98 + apx.nstride;
          } while (local_c98 != pAVar9);
        }
        amrex::Gpu::Elixir::~Elixir(&eli);
        result.smallend.vect._0_8_ = &PTR__BaseFab_00712bd8;
        amrex::BaseFab<double>::clear((BaseFab<double> *)&result);
      }
      amrex::MFIter::operator++((MFIter *)&u);
    } while ((int)local_910._8_4_ < local_900);
  }
  amrex::MFIter::~MFIter((MFIter *)&u);
  PVar50 = amrex::Geometry::periodicity(geom);
  u._M_elems[0]._0_1_ = (undefined1)PVar50.period.vect[0];
  u._M_elems[0]._1_7_ = PVar50.period.vect._1_7_;
  u._M_elems[1]._0_4_ = PVar50.period.vect[2];
  amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&advc.super_FabArray<amrex::FArrayBox>,(Periodicity *)&u,false);
  amrex::MFIter::MFIter((MFIter *)&u,(FabArrayBase *)aofs,true);
  if ((int)local_910._8_4_ < local_900) {
    local_c68 = (int *)(ulong)(uint)ncomp;
    do {
      amrex::MFIter::tilebox((Box *)local_8c8,(MFIter *)&u);
      pFVar18 = amrex::EBDataCollection::getMultiEBCellFlagFab
                          ((this->m_ebdc).
                           super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
      piVar30 = (int *)(local_910 + 8);
      if (local_8e8 != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar30 = (local_8e8->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + (int)local_910._8_4_;
      }
      pEVar8 = (pFVar18->m_fabs_v).
               super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
               _M_impl.super__Vector_impl_data._M_start[*piVar30];
      local_968.p = (pEVar8->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_968.ncomp = (pEVar8->super_BaseFab<amrex::EBCellFlag>).nvar;
      pBVar1 = &(pEVar8->super_BaseFab<amrex::EBCellFlag>).domain;
      local_968.begin.z = (pEVar8->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_968.begin.x = (pBVar1->smallend).vect[0];
      local_968.begin.y = (pBVar1->smallend).vect[1];
      lVar17 = (long)(pEVar8->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      lVar23 = (long)(pEVar8->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      lVar35 = (long)(pEVar8->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      local_968.jstride = (lVar23 - (pBVar1->smallend).vect[0]) + 1;
      local_968.kstride =
           (lVar17 - (pEVar8->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
           local_968.jstride;
      local_968.nstride = (lVar35 - local_968.begin.z) * local_968.kstride;
      local_968.end._0_8_ = lVar23 + 1U & 0xffffffff | lVar17 << 0x20;
      local_968.end.z = (int)lVar35;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_a10,&aofs->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,aofs_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_888,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      FVar14 = amrex::EBCellFlagFab::getType(pEVar8,(Box *)local_8c8);
      if (FVar14 != covered) {
        result.btype.itype = local_8c8._24_4_;
        result.smallend.vect[2] = local_8c8._8_4_ + -4;
        result.bigend.vect[0] = local_8c8._12_4_ + 4;
        result.smallend.vect[1] = local_8c8._4_4_ + -4;
        result.smallend.vect[0] = local_8c8._0_4_ + -4;
        result.bigend.vect[1] = local_8c8._16_4_ + 4;
        result.bigend.vect[2] = local_8c8._20_4_ + 4;
        FVar14 = amrex::EBCellFlagFab::getType(pEVar8,&result);
        if (FVar14 == regular) {
          if (0 < ncomp) {
            lVar17 = (long)(int)local_8c8._4_4_;
            in_stack_fffffffffffff308 =
                 (Array4<const_double> *)
                 ((lVar17 - local_a10.begin.y) * local_a10.jstride * 8 +
                  (long)(int)local_8c8._0_4_ * 8 + (long)local_a10.begin.x * -8 + (long)local_a10.p)
            ;
            lVar23 = (lVar17 - local_888.begin.y) * local_888.jstride * 8 +
                     (long)(int)local_8c8._0_4_ * 8 + (long)local_888.begin.x * -8 +
                     (long)local_888.p;
            in_stack_fffffffffffff300 = (int *)(local_888.kstride * 8);
            piVar30 = (int *)0x0;
            do {
              iVar16 = local_8c8._8_4_;
              if ((int)local_8c8._8_4_ <= (int)local_8c8._20_4_) {
                do {
                  if ((int)local_8c8._4_4_ <= (int)local_8c8._16_4_) {
                    ppdVar29 = (double **)
                               ((long)&in_stack_fffffffffffff308->p +
                               ((long)iVar16 - (long)local_a10.begin.z) * local_a10.kstride * 8);
                    lVar28 = ((long)iVar16 - (long)local_888.begin.z) *
                             (long)in_stack_fffffffffffff300 + lVar23;
                    lVar35 = lVar17;
                    do {
                      if ((int)local_8c8._0_4_ <= (int)local_8c8._12_4_) {
                        lVar31 = 0;
                        do {
                          ppdVar29[lVar31] =
                               (double *)(*(ulong *)(lVar28 + lVar31 * 8) ^ 0x8000000000000000);
                          lVar31 = lVar31 + 1;
                        } while ((local_8c8._12_4_ - local_8c8._0_4_) + 1 != (int)lVar31);
                      }
                      lVar35 = lVar35 + 1;
                      ppdVar29 = ppdVar29 + local_a10.jstride;
                      lVar28 = lVar28 + local_888.jstride * 8;
                    } while (local_8c8._16_4_ + 1 != (int)lVar35);
                  }
                  bVar38 = iVar16 != local_8c8._20_4_;
                  iVar16 = iVar16 + 1;
                } while (bVar38);
              }
              piVar30 = (int *)((long)piVar30 + 1);
              in_stack_fffffffffffff308 =
                   (Array4<const_double> *)(&in_stack_fffffffffffff308->p + local_a10.nstride);
              lVar23 = lVar23 + local_888.nstride * 8;
            } while (piVar30 != local_c68);
          }
        }
        else {
          amrex::EBDataCollection::getAreaFrac
                    ((this->m_ebdc).
                     super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          amrex::MultiCutFab::const_array
                    (&apx,(MultiCutFab *)result.smallend.vect._0_8_,(MFIter *)&u);
          amrex::EBDataCollection::getAreaFrac
                    ((this->m_ebdc).
                     super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          amrex::MultiCutFab::const_array
                    (&apy,(MultiCutFab *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]),
                     (MFIter *)&u);
          amrex::EBDataCollection::getAreaFrac
                    ((this->m_ebdc).
                     super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          amrex::MultiCutFab::const_array
                    (&apz,(MultiCutFab *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]),
                     (MFIter *)&u);
          amrex::EBDataCollection::getFaceCent
                    ((this->m_ebdc).
                     super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          amrex::MultiCutFab::const_array
                    (&fcx,(MultiCutFab *)result.smallend.vect._0_8_,(MFIter *)&u);
          amrex::EBDataCollection::getFaceCent
                    ((this->m_ebdc).
                     super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          amrex::MultiCutFab::const_array
                    (&fcy,(MultiCutFab *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]),
                     (MFIter *)&u);
          amrex::EBDataCollection::getFaceCent
                    ((this->m_ebdc).
                     super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          amrex::MultiCutFab::const_array
                    (&fcz,(MultiCutFab *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]),
                     (MFIter *)&u);
          this_01 = amrex::EBDataCollection::getCentroid
                              ((this->m_ebdc).
                               super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
          amrex::MultiCutFab::const_array((Array4<const_double> *)&advc_arr,this_01,(MFIter *)&u);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_7d8,this_00,(MFIter *)&u);
          local_608.p = (double *)CONCAT44(local_8c8._4_4_,local_8c8._0_4_);
          local_608.nstride._0_4_ = local_8c8._24_4_;
          local_608.kstride._4_4_ = local_8c8._20_4_;
          local_608.kstride._0_4_ = local_8c8._16_4_;
          local_608.jstride._0_4_ = local_8c8._8_4_;
          local_608.jstride._4_4_ = local_8c8._12_4_;
          iVar16 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
          if (iVar16 == 0) {
            iVar16 = (int)local_608.p + -3;
            uVar40 = 0x3fffffffd;
LAB_002f074f:
            iVar43 = (int)((ulong)uVar40 >> 0x20);
            local_608.jstride._0_4_ = (int)local_608.jstride + (int)uVar40;
            local_608.jstride._4_4_ = local_608.jstride._4_4_ + iVar43;
            local_608.kstride._0_4_ = (int)local_608.kstride + iVar43;
            local_608.p = (double *)CONCAT44(local_608.p._4_4_ + (int)uVar40,iVar16);
            local_608.kstride._4_4_ = local_608.kstride._4_4_ + iVar43;
          }
          else {
            iVar16 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
            if (iVar16 == 0) {
              iVar16 = (int)local_608.p + -2;
              uVar40 = 0x2fffffffe;
              goto LAB_002f074f;
            }
          }
          amrex::FArrayBox::FArrayBox
                    ((FArrayBox *)&result,(Box *)&local_608,ncomp,true,false,(Arena *)0x0);
          pAVar19 = (Arena *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
          if (pAVar19 == (Arena *)0x0) {
            pAVar19 = amrex::The_Arena();
          }
          amrex::Gpu::Elixir::Elixir(&eli_1,(void *)0x0,pAVar19);
          local_b10.p = (double *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]);
          local_b10.begin.y = local_c3c;
          local_b10.begin.x = result.btype.itype;
          local_b10.jstride = ((long)local_c38.y - (long)(int)result.btype.itype) + 1;
          local_b10.kstride = (((long)local_c38.z + 1) - (long)local_c3c) * local_b10.jstride;
          local_b10.nstride = (((long)(int)local_c2c + 1) - (long)local_c38.x) * local_b10.kstride;
          local_b10.end._0_8_ = (long)local_c38.y + 1U & 0xffffffff | (long)local_c38.z + 1 << 0x20;
          local_b10.begin.z = local_c38.x;
          local_b10.end.z = (int)((long)(int)local_c2c + 1);
          local_b10.ncomp = local_c24;
          iVar16 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
          auVar12 = _DAT_0065b9b0;
          auVar11 = _DAT_0065b9a0;
          if ((iVar16 == 0) && (local_b10.begin.z < local_b10.end.z)) {
            uVar37 = ~local_b10.begin.x + local_b10.end.x;
            auVar41._4_4_ = 0;
            auVar41._0_4_ = uVar37;
            auVar41._8_4_ = uVar37;
            auVar41._12_4_ = 0;
            auVar41 = auVar41 ^ _DAT_0065b9b0;
            iVar16 = local_b10.begin.z;
            do {
              if (local_b10.begin.y < local_b10.end.y) {
                lVar17 = (long)local_b10.p +
                         ((long)iVar16 - (long)local_b10.begin.z) * local_b10.kstride * 8 + 8;
                iVar43 = local_b10.begin.y;
                do {
                  if (local_b10.begin.x < local_b10.end.x) {
                    uVar34 = 0;
                    do {
                      auVar45._8_4_ = (int)uVar34;
                      auVar45._0_8_ = uVar34;
                      auVar45._12_4_ = (int)(uVar34 >> 0x20);
                      auVar46 = (auVar45 | auVar11) ^ auVar12;
                      bVar38 = auVar41._0_4_ < auVar46._0_4_;
                      iVar44 = auVar41._4_4_;
                      iVar49 = auVar46._4_4_;
                      if ((bool)(~(iVar44 < iVar49 || iVar49 == iVar44 && bVar38) & 1)) {
                        *(undefined8 *)(lVar17 + (uVar34 - 1) * 8) = 0x3ff0000000000000;
                      }
                      if (iVar44 >= iVar49 && (iVar49 != iVar44 || !bVar38)) {
                        *(undefined8 *)(lVar17 + uVar34 * 8) = 0x3ff0000000000000;
                      }
                      uVar34 = uVar34 + 2;
                    } while (((ulong)uVar37 + 2 & 0x1fffffffe) != uVar34);
                  }
                  iVar43 = iVar43 + 1;
                  lVar17 = lVar17 + local_b10.jstride * 8;
                } while (local_b10.end.y != iVar43);
              }
              bVar38 = iVar16 != local_b10.end.z + -1;
              iVar16 = iVar16 + 1;
            } while (bVar38);
          }
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&local_4d0,&advc.super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&u);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_510,&state->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,local_c5c);
          local_758[0] = local_748;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_758,*(long *)redistribution_type._M_dataplus._M_p,
                     *(long *)(redistribution_type._M_dataplus._M_p + 8) +
                     *(long *)redistribution_type._M_dataplus._M_p);
          local_688._16_16_ = (undefined1  [16])0x0;
          local_688._0_16_ = (undefined1  [16])0x0;
          local_668.x = 1;
          local_668.y = 1;
          local_668.z = 1;
          local_65c = (undefined1  [16])0x0;
          redistribution_type_00._M_string_length._0_4_ = 2;
          redistribution_type_00._M_dataplus._M_p = (pointer)local_758;
          redistribution_type_00._M_string_length._4_4_ = 0;
          redistribution_type_00.field_2._M_local_buf[0] = (char)local_688;
          redistribution_type_00.field_2._M_allocated_capacity._1_7_ = (int7)((ulong)local_688 >> 8)
          ;
          redistribution_type_00.field_2._8_8_ = in_stack_fffffffffffff2f8;
          Redistribution::Apply
                    ((Box *)local_8c8,ncomp,&local_a10,(Array4<double> *)&local_4d0,&local_510,
                     (Array4<double> *)&local_b10,&local_968,&apx,&apy,&apz,&local_7d8,&fcx,&fcy,
                     &fcz,(Array4<const_double> *)&advc_arr,d_bc,geom,local_9d0,
                     redistribution_type_00,(int)in_stack_fffffffffffff300,0.5,
                     in_stack_fffffffffffff308);
          if (local_758[0] != local_748) {
            operator_delete(local_758[0],local_748[0] + 1);
          }
          auVar12 = _DAT_0065b9b0;
          auVar11 = _DAT_0065b9a0;
          if (0 < ncomp) {
            uVar37 = local_8c8._12_4_ - local_8c8._0_4_;
            auVar42._4_4_ = 0;
            auVar42._0_4_ = uVar37;
            auVar42._8_4_ = uVar37;
            auVar42._12_4_ = 0;
            lVar17 = (long)local_a10.p +
                     ((long)(int)local_8c8._4_4_ - (long)local_a10.begin.y) * local_a10.jstride * 8
                     + (long)(int)local_8c8._0_4_ * 8 + (long)local_a10.begin.x * -8 + 8;
            in_stack_fffffffffffff308 = (Array4<const_double> *)(local_a10.kstride * 8);
            piVar30 = (int *)0x0;
            do {
              in_stack_fffffffffffff300 = piVar30;
              iVar16 = local_8c8._8_4_;
              if ((int)local_8c8._8_4_ <= (int)local_8c8._20_4_) {
                do {
                  if ((int)local_8c8._4_4_ <= (int)local_8c8._16_4_) {
                    lVar35 = ((long)iVar16 - (long)local_a10.begin.z) *
                             (long)in_stack_fffffffffffff308 + lVar17;
                    lVar23 = (long)(int)local_8c8._4_4_;
                    do {
                      if ((int)local_8c8._0_4_ <= (int)local_8c8._12_4_) {
                        uVar34 = 0;
                        do {
                          auVar47._8_4_ = (int)uVar34;
                          auVar47._0_8_ = uVar34;
                          auVar47._12_4_ = (int)(uVar34 >> 0x20);
                          auVar48 = auVar42 ^ auVar12;
                          auVar46 = (auVar47 | auVar11) ^ auVar12;
                          bVar38 = auVar48._0_4_ < auVar46._0_4_;
                          iVar43 = auVar48._4_4_;
                          iVar44 = auVar46._4_4_;
                          if ((bool)(~(iVar43 < iVar44 || iVar44 == iVar43 && bVar38) & 1)) {
                            *(ulong *)(lVar35 + -8 + uVar34 * 8) =
                                 *(ulong *)(lVar35 + -8 + uVar34 * 8) ^ 0x8000000000000000;
                          }
                          if (iVar43 >= iVar44 && (iVar44 != iVar43 || !bVar38)) {
                            *(ulong *)(lVar35 + uVar34 * 8) =
                                 *(ulong *)(lVar35 + uVar34 * 8) ^ 0x8000000000000000;
                          }
                          uVar34 = uVar34 + 2;
                        } while (((ulong)uVar37 + 2 & 0x1fffffffe) != uVar34);
                      }
                      lVar23 = lVar23 + 1;
                      lVar35 = lVar35 + local_a10.jstride * 8;
                    } while (local_8c8._16_4_ + 1 != (int)lVar23);
                  }
                  bVar38 = iVar16 != local_8c8._20_4_;
                  iVar16 = iVar16 + 1;
                } while (bVar38);
              }
              lVar17 = lVar17 + local_a10.nstride * 8;
              piVar30 = (int *)((long)in_stack_fffffffffffff300 + 1U);
            } while ((int *)((long)in_stack_fffffffffffff300 + 1U) != local_c68);
          }
          amrex::Gpu::Elixir::~Elixir(&eli_1);
          result.smallend.vect._0_8_ = &PTR__BaseFab_00712bd8;
          amrex::BaseFab<double>::clear((BaseFab<double> *)&result);
        }
      }
      amrex::MFIter::operator++((MFIter *)&u);
    } while ((int)local_910._8_4_ < local_900);
  }
  amrex::MFIter::~MFIter((MFIter *)&u);
  amrex::MultiFab::~MultiFab(&divu_mac);
  amrex::MultiFab::~MultiFab(&advc);
  if (iconserv_d.m_data != (pointer)0x0) {
    operator_delete(iconserv_d.m_data,iconserv_d.m_capacity << 2);
  }
  return;
}

Assistant:

void
EBGodunov::ComputeAofs ( MultiFab& aofs, const int aofs_comp, const int ncomp,
                         MultiFab const& state, const int state_comp,
                         AMREX_D_DECL( MultiFab const& umac,
                                       MultiFab const& vmac,
                                       MultiFab const& wmac),
                         AMREX_D_DECL( MultiFab& xedge,
                                       MultiFab& yedge,
                                       MultiFab& zedge),
                         const int  edge_comp,
                         const bool known_edgestate,
                         AMREX_D_DECL( MultiFab& xfluxes,
                                       MultiFab& yfluxes,
                                       MultiFab& zfluxes),
                         int fluxes_comp,
                         MultiFab const& fq,
                         const int fq_comp,
                         MultiFab const& divu,
                         Vector<BCRec> const& h_bc,
                         BCRec const* d_bc,
                         Geometry const& geom,
                         Vector<int>& iconserv,
                         const Real dt,
                         const bool is_velocity,
                         std::string redistribution_type)
{
    BL_PROFILE("EBGodunov::ComputeAofs()");

    bool fluxes_are_area_weighted = true;

    // Make a device copy of the iconserv vector for use in kernels
    Gpu::DeviceVector<int> iconserv_d(iconserv.size());
    Gpu::copy(Gpu::hostToDevice, iconserv.begin(), iconserv.end(), iconserv_d.begin());
    int const* iconserv_ptr = iconserv_d.data();

    AMREX_ALWAYS_ASSERT(state.hasEBFabFactory());

    auto const& ebfact= dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());
    auto const& flags = ebfact.getMultiEBCellFlagFab();
    auto const& fcent = ebfact.getFaceCent();
    auto const& ccent = ebfact.getCentroid();
    auto const& vfrac = ebfact.getVolFrac();
    auto const& areafrac = ebfact.getAreaFrac();

    // Create temporary holder for advection term. Needed so we can call FillBoundary.
    MultiFab advc(state.boxArray(),state.DistributionMap(),ncomp,3,MFInfo(),ebfact);
    advc.setVal(0.);

    // if we need convective form, we must also compute
    // div(u_mac)
    MultiFab divu_mac(state.boxArray(),state.DistributionMap(),1,0, MFInfo(), ebfact);
    for (Long i = 0; i < iconserv.size(); ++i)
    {
        if (!iconserv[i])
        {
            Array<MultiFab const*,AMREX_SPACEDIM> u;
            AMREX_D_TERM(u[0] = &umac;,
                         u[1] = &vmac;,
                         u[2] = &wmac;);

            if (!ebfact.isAllRegular())
                amrex::EB_computeDivergence(divu_mac,u,geom,true);
            else
                amrex::computeDivergence(divu_mac,u,geom);

            break;
        }
    }

    // Compute -div instead of computing div -- this is just for consistency
    // with the way we HAVE to do it for EB (because redistribution operates on
    // -div rather than div
    Real mult = -1.0;

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const Box& bx   = mfi.tilebox();

        auto const& flagfab = ebfact.getMultiEBCellFlagFab()[mfi];
    // A regular box uses 3 ghost cells:
    // We predict the state on the edge based box; that calls slopes on
    // i & i-1; slopes then looks at (i-1)-2 for 4th order slopes
    // => test on bx grow 3
        bool regular = (flagfab.getType(amrex::grow(bx,3)) == FabType::regular);

        // Get handlers to Array4
        //
        AMREX_D_TERM( const auto& fx = xfluxes.array(mfi,fluxes_comp);,
                      const auto& fy = yfluxes.array(mfi,fluxes_comp);,
                      const auto& fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( const auto& xed = xedge.array(mfi,edge_comp);,
                      const auto& yed = yedge.array(mfi,edge_comp);,
                      const auto& zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( const auto& u = umac.const_array(mfi);,
                      const auto& v = vmac.const_array(mfi);,
                      const auto& w = wmac.const_array(mfi););

    Array4<Real> advc_arr = advc.array(mfi);

        if (flagfab.getType(bx) == FabType::covered)
        {
        AMREX_D_TERM( const Box& xbx = mfi.nodaltilebox(0);,
              const Box& ybx = mfi.nodaltilebox(1);,
              const Box& zbx = mfi.nodaltilebox(2); );

            auto const& aofs_arr = aofs.array(mfi, aofs_comp);

            amrex::ParallelFor(
                bx, ncomp, [aofs_arr] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { aofs_arr( i, j, k, n ) = covered_val;},

                xbx, ncomp, [fx,xed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fx( i, j, k, n ) = 0.0; xed( i, j, k, n ) = covered_val;},

                ybx, ncomp, [fy,yed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fy( i, j, k, n ) = 0.0; yed( i, j, k, n ) = covered_val;});

#if (AMREX_SPACEDIM==3)
            amrex::ParallelFor(
                zbx, ncomp, [fz,zed]AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fz( i, j, k, n ) = 0.0; zed( i, j, k, n ) = covered_val;});
#endif
        }
        else
        {
        if (regular)   // Plain Godunov
        {
            if (!known_edgestate)
            {
                Godunov::ComputeEdgeState( bx, ncomp,
                                           state.array(mfi,state_comp),
                                           AMREX_D_DECL( xed, yed, zed ),
                                           AMREX_D_DECL( u, v, w ),
                                           divu.array(mfi),
                                           fq.array(mfi,fq_comp),
                                           geom, dt, d_bc,
                                           iconserv_ptr,
                                           false,
                                           false,
                                           is_velocity );
            }

            HydroUtils::ComputeFluxes( bx,
                                       AMREX_D_DECL( fx, fy, fz ),
                                       AMREX_D_DECL( u, v, w ),
                                       AMREX_D_DECL( xed, yed, zed ),
                                       geom, ncomp, fluxes_are_area_weighted );

            HydroUtils::ComputeDivergence( bx, advc_arr,
                                           AMREX_D_DECL( fx, fy, fz ),
                                           ncomp, geom,
                                           mult, fluxes_are_area_weighted);

            // Compute the convective form if needed by accounting for extra term
            auto const& divu_arr  = divu_mac.array(mfi);
            amrex::ParallelFor(bx, ncomp, [=]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                if (!iconserv_ptr[n])
                {
                    Real q = xed(i,j,k,n) + xed(i+1,j,k,n)
                           + yed(i,j,k,n) + yed(i,j+1,k,n);
#if (AMREX_SPACEDIM == 2)
                    q *= 0.25;
#else
                    q += zed(i,j,k,n) + zed(i,j,k+1,n);
                    q /= 6.0;
#endif
                    advc_arr(i,j,k,n) += q*divu_arr(i,j,k);
                }
            });

        }
        else     // EB Godunov
        {
            AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fcz = fcent[2]->const_array(mfi););

            AMREX_D_TERM(Array4<Real const> const& apx = areafrac[0]->const_array(mfi);,
                         Array4<Real const> const& apy = areafrac[1]->const_array(mfi);,
                         Array4<Real const> const& apz = areafrac[2]->const_array(mfi););

            Array4<Real const> const& ccent_arr = ccent.const_array(mfi);
            Array4<Real const> const& vfrac_arr = vfrac.const_array(mfi);
            auto const& flags_arr  = flags.const_array(mfi);

        //FIXME - compare to HydroUtils which hard codes 4 ghost cells for all
            int ngrow = 4;

            if (redistribution_type=="StateRedist")
                ++ngrow;

            FArrayBox tmpfab(amrex::grow(bx,ngrow),  (4*AMREX_SPACEDIM + 2)*ncomp);
            Elixir    eli = tmpfab.elixir();


            if (!known_edgestate)
            {
                EBGodunov::ComputeEdgeState( bx, ncomp,
                                             state.array(mfi,state_comp),
                                             AMREX_D_DECL( xed, yed, zed ),
                                             AMREX_D_DECL( u, v, w ),
                                             divu.array(mfi),
                                             fq.array(mfi,fq_comp),
                                             geom, dt, h_bc, d_bc,
                                             iconserv_ptr,
                                             tmpfab.dataPtr(),
                                             flags_arr,
                                             AMREX_D_DECL( apx, apy, apz ),
                                             vfrac_arr,
                                             AMREX_D_DECL( fcx, fcy, fcz ),
                                             ccent_arr,
                                             is_velocity,
                                             Array4<Real const>{} );
            }

            HydroUtils::EB_ComputeFluxes( bx,
                                          AMREX_D_DECL( fx, fy, fz ),
                                          AMREX_D_DECL( u, v, w ),
                                          AMREX_D_DECL( xed, yed, zed ),
                                          AMREX_D_DECL( apx, apy, apz ),
                                          geom, ncomp, flags_arr, fluxes_are_area_weighted );

            // div at ncomp*3 to make space for the 3 redistribute temporaries
            HydroUtils::EB_ComputeDivergence( bx,
                                              advc_arr,
                                              AMREX_D_DECL( fx, fy, fz ),
                                              vfrac_arr, ncomp, geom,
                                              mult, fluxes_are_area_weighted);

            // Compute the convective form if needed by accounting for extra term
            auto const& divu_arr  = divu_mac.array(mfi);
            amrex::ParallelFor(bx, ncomp, [=]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                if (!iconserv_ptr[n])
                {
          if ( vfrac_arr(i,j,k) != 0 )
                  {
                    Real q = xed(i,j,k,n)*apx(i,j,k) + xed(i+1,j,k,n)*apx(i+1,j,k)
                           + yed(i,j,k,n)*apy(i,j,k) + yed(i,j+1,k,n)*apy(i,j+1,k);
#if (AMREX_SPACEDIM == 2)
                    q /= (apx(i,j,k)+apx(i+1,j,k)+apy(i,j,k)+apy(i,j+1,k));
#else
                    q += zed(i,j,k,n)*apz(i,j,k) + zed(i,j,k+1,n)*apz(i,j,k+1);
                    q /= (apx(i,j,k)+apx(i+1,j,k)+apy(i,j,k)+apy(i,j+1,k)+apz(i,j,k)+apz(i,j,k+1));
#endif
                    advc_arr(i,j,k,n) += q*divu_arr(i,j,k);
          }
                 }
            });
      }
    }
    }

    advc.FillBoundary(geom.periodicity());

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        auto const& flagfab = ebfact.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();
    auto const& aofs_arr = aofs.array(mfi, aofs_comp);
    auto const& advc_arr = advc.array(mfi);

        if (flagfab.getType(bx) != FabType::covered )
    {
      // FIXME? not sure if 4 is really needed or if 3 could do
      // But this is a safe choice
      if (flagfab.getType(grow(bx,4)) != FabType::regular)
      {
        //
        // Redistribute
        //
        AMREX_D_TERM( auto apx = ebfact.getAreaFrac()[0]->const_array(mfi);,
              auto apy = ebfact.getAreaFrac()[1]->const_array(mfi);,
              auto apz = ebfact.getAreaFrac()[2]->const_array(mfi); );

        AMREX_D_TERM( Array4<Real const> fcx = ebfact.getFaceCent()[0]->const_array(mfi);,
              Array4<Real const> fcy = ebfact.getFaceCent()[1]->const_array(mfi);,
              Array4<Real const> fcz = ebfact.getFaceCent()[2]->const_array(mfi););

        Array4<Real const> ccc = ebfact.getCentroid().const_array(mfi);
            Array4<Real const> const& vfrac_arr = vfrac.const_array(mfi);

        // This is scratch space if calling StateRedistribute,
            //  but is used as the weights (here set to 1) if calling
            //  FluxRedistribute
        Box gbx = bx;

        if (redistribution_type == "StateRedist")
          gbx.grow(3);
        else if (redistribution_type == "FluxRedist")
          gbx.grow(2);

        FArrayBox tmpfab(gbx, ncomp);
        Elixir eli = tmpfab.elixir();
            Array4<Real> scratch = tmpfab.array(0);
            if (redistribution_type == "FluxRedist")
            {
                amrex::ParallelFor(Box(scratch),
                [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                { scratch(i,j,k) = 1.;});
            }

        Redistribution::Apply( bx, ncomp, aofs_arr, advc.array(mfi),
                   state.const_array(mfi, state_comp), scratch, flag,
                                   AMREX_D_DECL(apx,apy,apz), vfrac_arr,
                   AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bc,
                                   geom, dt, redistribution_type );

        // Change sign because we computed -div for all cases
        amrex::ParallelFor(bx, ncomp, [aofs_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) *=  - 1.0; });
      }
      else
      {
        // Change sign because for EB we computed -div
            amrex::ParallelFor(bx, ncomp, [aofs_arr, advc_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) =  -advc_arr(i,j,k,n); });
      }
    }
    }
}